

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::SubMessagePrefix
          (string *__return_storage_ptr__,internal *this,string *prefix,FieldDescriptor *field,
          int index)

{
  long lVar1;
  string *psVar2;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  char *local_50;
  char local_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&prefix->_M_dataplus);
  if ((field->field_0x1 & 8) == 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(field->all_names_->_M_dataplus)._M_p);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)field->all_names_[1]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (index != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(index,local_48);
    local_58 = lVar1 - (long)local_48;
    local_78[0] = local_68;
    local_50 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_48,lVar1);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(absl::StrCat(index));
    result.append("]");
  }
  result.append(".");
  return result;
}